

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O1

void __thiscall Omega_h::Comm::Comm(Comm *this,Library *library_in,bool is_graph,bool sends_to_self)

{
  Read<int> *pRVar1;
  Read<int> *pRVar2;
  int *piVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Alloc *pAVar5;
  HostRead<int> *pHVar6;
  LO LVar7;
  undefined7 in_register_00000011;
  bool bVar8;
  initializer_list<int> l;
  string local_98;
  Read<int> local_78;
  HostRead<int> *local_60;
  int local_54;
  Read<signed_char> local_50;
  Read<signed_char> local_40;
  
  this->library_ = library_in;
  pRVar1 = &this->srcs_;
  pRVar2 = &this->dsts_;
  local_60 = &this->host_dsts_;
  (this->srcs_).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->srcs_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->dsts_).write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->dsts_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->host_srcs_).read_.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->host_srcs_).read_.write_.shared_alloc_.direct_ptr = (void *)0x0;
  (this->host_dsts_).read_.write_.shared_alloc_.alloc = (Alloc *)0x0;
  (this->host_dsts_).read_.write_.shared_alloc_.direct_ptr = (void *)0x0;
  if ((int)CONCAT71(in_register_00000011,is_graph) == 0) {
    if (sends_to_self) {
      fail("assertion %s failed at %s +%d\n","!sends_to_self",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_comm.cpp"
           ,0x3f);
    }
  }
  else {
    paVar4 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar4;
    if (sends_to_self) {
      local_54 = 0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      l._M_len = 1;
      l._M_array = &local_54;
      Read<int>::Read(&local_78,l,&local_98);
      pAVar5 = (pRVar1->write_).shared_alloc_.alloc;
      if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
        piVar3 = &pAVar5->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(pAVar5);
          operator_delete(pAVar5,0x48);
        }
      }
      (this->srcs_).write_.shared_alloc_.alloc = local_78.write_.shared_alloc_.alloc;
      (this->srcs_).write_.shared_alloc_.direct_ptr = local_78.write_.shared_alloc_.direct_ptr;
      if ((((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
           local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + -1;
        (pRVar1->write_).shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_78.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_78.write_.shared_alloc_.direct_ptr = (void *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar4) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      LVar7 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>();
      Read<int>::Read(&local_78,(initializer_list<int>)ZEXT816(0),&local_98);
      pAVar5 = (pRVar1->write_).shared_alloc_.alloc;
      if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
        piVar3 = &pAVar5->use_count;
        *piVar3 = *piVar3 + -1;
        if (*piVar3 == 0) {
          Alloc::~Alloc(pAVar5);
          operator_delete(pAVar5,0x48);
        }
      }
      (this->srcs_).write_.shared_alloc_.alloc = local_78.write_.shared_alloc_.alloc;
      (this->srcs_).write_.shared_alloc_.direct_ptr = local_78.write_.shared_alloc_.direct_ptr;
      if ((((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
           local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + -1;
        (pRVar1->write_).shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_78.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_78.write_.shared_alloc_.direct_ptr = (void *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar4) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      LVar7 = -1;
    }
    this->self_dst_ = LVar7;
    this->self_src_ = LVar7;
    pAVar5 = (this->dsts_).write_.shared_alloc_.alloc;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    local_40.write_.shared_alloc_.alloc = (pRVar1->write_).shared_alloc_.alloc;
    (pRVar2->write_).shared_alloc_.alloc = local_40.write_.shared_alloc_.alloc;
    bVar8 = ((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0;
    if (bVar8 && local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        (pRVar2->write_).shared_alloc_.alloc =
             (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_40.write_.shared_alloc_.alloc)->use_count =
             (local_40.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_40.write_.shared_alloc_.direct_ptr = (this->srcs_).write_.shared_alloc_.direct_ptr;
    (this->dsts_).write_.shared_alloc_.direct_ptr = local_40.write_.shared_alloc_.direct_ptr;
    if (bVar8 && local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_40.write_.shared_alloc_.alloc =
             (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_40.write_.shared_alloc_.alloc)->use_count =
             (local_40.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    HostRead<int>::HostRead((HostRead<int> *)&local_98,&local_40);
    pAVar5 = (this->host_srcs_).read_.write_.shared_alloc_.alloc;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    (this->host_srcs_).read_.write_.shared_alloc_.alloc = (Alloc *)local_98._M_dataplus._M_p;
    (this->host_srcs_).read_.write_.shared_alloc_.direct_ptr = (void *)local_98._M_string_length;
    if ((((ulong)local_98._M_dataplus._M_p & 7) == 0 &&
         (Alloc *)local_98._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      *(int *)(local_98._M_dataplus._M_p + 0x30) = *(int *)(local_98._M_dataplus._M_p + 0x30) + -1;
      (this->host_srcs_).read_.write_.shared_alloc_.alloc =
           (Alloc *)(*(size_type *)local_98._M_dataplus._M_p * 8 + 1);
    }
    pAVar5 = local_40.write_.shared_alloc_.alloc;
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
        local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_40.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    pHVar6 = local_60;
    local_50.write_.shared_alloc_.alloc = (pRVar2->write_).shared_alloc_.alloc;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.write_.shared_alloc_.alloc =
             (Alloc *)((local_50.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_50.write_.shared_alloc_.alloc)->use_count =
             (local_50.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.write_.shared_alloc_.direct_ptr = (this->dsts_).write_.shared_alloc_.direct_ptr;
    HostRead<int>::HostRead((HostRead<int> *)&local_98,&local_50);
    pAVar5 = (pHVar6->read_).write_.shared_alloc_.alloc;
    if (((ulong)pAVar5 & 7) == 0 && pAVar5 != (Alloc *)0x0) {
      piVar3 = &pAVar5->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(pAVar5);
        operator_delete(pAVar5,0x48);
      }
    }
    pAVar5 = local_50.write_.shared_alloc_.alloc;
    (this->host_dsts_).read_.write_.shared_alloc_.alloc = (Alloc *)local_98._M_dataplus._M_p;
    (this->host_dsts_).read_.write_.shared_alloc_.direct_ptr = (void *)local_98._M_string_length;
    if ((((ulong)local_98._M_dataplus._M_p & 7) == 0 &&
         (Alloc *)local_98._M_dataplus._M_p != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      *(int *)(local_98._M_dataplus._M_p + 0x30) = *(int *)(local_98._M_dataplus._M_p + 0x30) + -1;
      (pHVar6->read_).write_.shared_alloc_.alloc =
           (Alloc *)(*(long *)local_98._M_dataplus._M_p * 8 + 1);
    }
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    if (((ulong)local_50.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar3 = &(local_50.write_.shared_alloc_.alloc)->use_count;
      *piVar3 = *piVar3 + -1;
      if (*piVar3 == 0) {
        Alloc::~Alloc(local_50.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
  }
  return;
}

Assistant:

Comm::Comm(Library* library_in, bool is_graph, bool sends_to_self)
    : library_(library_in) {
  if (is_graph) {
    if (sends_to_self) {
      srcs_ = Read<LO>({0});
      self_src_ = self_dst_ = 0;
    } else {
      srcs_ = Read<LO>({});
      self_src_ = self_dst_ = -1;
    }
    dsts_ = srcs_;
    host_srcs_ = HostRead<I32>(srcs_);
    host_dsts_ = HostRead<I32>(dsts_);
  } else {
    OMEGA_H_CHECK(!sends_to_self);
  }
}